

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O3

void set_counting_callbacks(secp256k1_context *ctx0,int *ecount)

{
  secp256k1_context *psVar1;
  
  psVar1 = secp256k1_context_static;
  if (secp256k1_context_static == ctx0) {
    (*(ctx0->illegal_callback).fn)("ctx != secp256k1_context_static",(ctx0->illegal_callback).data);
    psVar1 = secp256k1_context_static;
  }
  else {
    (ctx0->error_callback).fn = counting_illegal_callback_fn;
    (ctx0->error_callback).data = ecount;
  }
  if (psVar1 != ctx0) {
    (ctx0->illegal_callback).fn = counting_illegal_callback_fn;
    (ctx0->illegal_callback).data = ecount;
    return;
  }
  (*(ctx0->illegal_callback).fn)("ctx != secp256k1_context_static",(ctx0->illegal_callback).data);
  return;
}

Assistant:

static void set_counting_callbacks(secp256k1_context *ctx0, int *ecount) {
    secp256k1_context_set_error_callback(ctx0, counting_illegal_callback_fn, ecount);
    secp256k1_context_set_illegal_callback(ctx0, counting_illegal_callback_fn, ecount);
}